

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O1

void duckdb_destroy_result(duckdb_result *result)

{
  duckdb_column *pdVar1;
  undefined8 *__ptr;
  bool *__ptr_00;
  long *plVar2;
  undefined8 *puVar3;
  idx_t iVar4;
  ulong uVar5;
  idx_t iVar6;
  DuckDBResultData *result_data;
  
  if (result->deprecated_columns != (duckdb_column *)0x0) {
    if (result->deprecated_column_count != 0) {
      uVar5 = 0;
      do {
        pdVar1 = result->deprecated_columns;
        __ptr = (undefined8 *)pdVar1[uVar5].deprecated_data;
        __ptr_00 = pdVar1[uVar5].deprecated_nullmask;
        if (__ptr != (undefined8 *)0x0) {
          iVar6 = result->deprecated_row_count;
          if (pdVar1[uVar5].deprecated_type == DUCKDB_TYPE_VARCHAR) {
            if (iVar6 != 0) {
              iVar4 = 0;
              do {
                if ((void *)__ptr[iVar4] != (void *)0x0) {
                  free((void *)__ptr[iVar4]);
                }
                iVar4 = iVar4 + 1;
              } while (iVar6 != iVar4);
            }
          }
          else {
            puVar3 = __ptr;
            if (pdVar1[uVar5].deprecated_type == DUCKDB_TYPE_BLOB) {
              for (; iVar6 != 0; iVar6 = iVar6 - 1) {
                if ((void *)*puVar3 != (void *)0x0) {
                  free((void *)*puVar3);
                }
                puVar3 = puVar3 + 2;
              }
            }
          }
          free(__ptr);
        }
        if (__ptr_00 != (bool *)0x0) {
          free(__ptr_00);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < result->deprecated_column_count);
    }
    free(result->deprecated_columns);
  }
  plVar2 = (long *)result->internal_data;
  if (plVar2 != (long *)0x0) {
    if ((long *)*plVar2 != (long *)0x0) {
      (**(code **)(*(long *)*plVar2 + 8))();
    }
    *plVar2 = 0;
    operator_delete(plVar2);
  }
  result->deprecated_error_message = (char *)0x0;
  result->internal_data = (void *)0x0;
  result->deprecated_rows_changed = 0;
  result->deprecated_columns = (duckdb_column *)0x0;
  result->deprecated_column_count = 0;
  result->deprecated_row_count = 0;
  return;
}

Assistant:

void duckdb_destroy_result(duckdb_result *result) {
	if (result->deprecated_columns) {
		for (idx_t i = 0; i < result->deprecated_column_count; i++) {
			DuckdbDestroyColumn(result->deprecated_columns[i], result->deprecated_row_count);
		}
		duckdb_free(result->deprecated_columns);
	}
	if (result->internal_data) {
		auto result_data = reinterpret_cast<duckdb::DuckDBResultData *>(result->internal_data);
		delete result_data;
	}
	memset(result, 0, sizeof(duckdb_result));
}